

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userobject.cpp
# Opt level: O2

bool __thiscall camp::UserObject::operator==(UserObject *this,UserObject *other)

{
  element_type *peVar1;
  UserProperty *pUVar2;
  int iVar3;
  int iVar4;
  ParentObject *pPVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  scoped_ptr<camp::ParentObject> *this_00;
  scoped_ptr<camp::ParentObject> *this_01;
  
  while( true ) {
    peVar1 = (((ParentObject *)this)->object).m_holder.
             super___shared_ptr<camp::detail::AbstractObjectHolder,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if ((peVar1 != (element_type *)0x0) &&
       ((((ParentObject *)other)->object).m_holder.
        super___shared_ptr<camp::detail::AbstractObjectHolder,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0)) {
      iVar3 = (*peVar1->_vptr_AbstractObjectHolder[2])();
      iVar4 = (*((((ParentObject *)other)->object).m_holder.
                 super___shared_ptr<camp::detail::AbstractObjectHolder,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_vptr_AbstractObjectHolder[2])();
      return CONCAT44(extraout_var,iVar3) == CONCAT44(extraout_var_00,iVar4);
    }
    if (((((ParentObject *)this)->object).m_parent.px == (ParentObject *)0x0) ||
       ((((ParentObject *)other)->object).m_parent.px == (ParentObject *)0x0)) break;
    this_01 = &(((ParentObject *)this)->object).m_parent;
    this_00 = &(((ParentObject *)other)->object).m_parent;
    pPVar5 = boost::scoped_ptr<camp::ParentObject>::operator->(this_01);
    pUVar2 = pPVar5->member;
    pPVar5 = boost::scoped_ptr<camp::ParentObject>::operator->(this_00);
    if (pUVar2 != pPVar5->member) {
      return false;
    }
    this = &boost::scoped_ptr<camp::ParentObject>::operator->(this_01)->object;
    other = &boost::scoped_ptr<camp::ParentObject>::operator->(this_00)->object;
  }
  return (((ParentObject *)other)->object).m_class == (Class *)0x0 &&
         (((ParentObject *)this)->object).m_class == (Class *)0x0;
}

Assistant:

bool UserObject::operator==(const UserObject& other) const
{
    if (m_holder && other.m_holder)
    {
        return m_holder->object() == other.m_holder->object();
    }
    else if (m_parent && other.m_parent)
    {
        return (&m_parent->member == &other.m_parent->member) && (m_parent->object == other.m_parent->object);
    }
    else if (!m_class && !other.m_class)
    {
        // Both are UserObject::nothing
        return true;
    }
    else
    {
        return false;
    }
}